

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

wchar_t t_cmp_tkind(void *a,void *b)

{
  wchar_t wVar1;
  wchar_t wVar2;
  trap_kind_conflict1 *ptVar3;
  trap_kind_conflict1 *ptVar4;
  wchar_t c;
  trap_kind *tb;
  trap_kind *ta;
  wchar_t b_val;
  wchar_t a_val;
  void *b_local;
  void *a_local;
  
  wVar2 = *b;
  ptVar3 = trap_info + *a;
  ptVar4 = trap_info + wVar2;
  wVar1 = trap_order(*a);
  wVar2 = trap_order(wVar2);
  a_local._4_4_ = wVar1 - wVar2;
  if (a_local._4_4_ == L'\0') {
    if (ptVar3->name == (char *)0x0) {
      if (ptVar4->name == (char *)0x0) {
        a_local._4_4_ = L'\0';
      }
      else {
        a_local._4_4_ = L'\xffffffff';
      }
    }
    else if (ptVar4->name == (char *)0x0) {
      a_local._4_4_ = L'\x01';
    }
    else {
      a_local._4_4_ = strcmp(ptVar3->name,ptVar4->name);
    }
  }
  return a_local._4_4_;
}

Assistant:

static int t_cmp_tkind(const void *a, const void *b)
{
	const int a_val = *(const int *)a;
	const int b_val = *(const int *)b;
	const struct trap_kind *ta = &trap_info[a_val];
	const struct trap_kind *tb = &trap_info[b_val];

	/* Group by */
	int c = trap_order(a_val) - trap_order(b_val);
	if (c) return c;

	/* Order by name */
	if (ta->name) {
		if (tb->name)
			return strcmp(ta->name, tb->name);
		else
			return 1;
	} else if (tb->name) {
		return -1;
	}

	return 0;
}